

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O0

void __thiscall JAMA::SVD<double>::SVD(SVD<double> *this,DynamicRectMatrix<double> *Arg)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  uint *puVar9;
  reference pvVar10;
  double *pdVar11;
  DynamicRectMatrix<double> *in_RSI;
  int iVar12;
  DynamicRectMatrix<double> *in_RDI;
  double dVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double t_8;
  double sn_2;
  double cs_2;
  double t_7;
  double g;
  double f_2;
  double shift;
  double c;
  double b;
  double ek;
  double sk;
  double epm1;
  double spm1;
  double sp;
  double scale;
  double sn_1;
  double cs_1;
  double t_6;
  double f_1;
  double sn;
  double cs;
  double t_5;
  double f;
  double t_4;
  int ks;
  int kase;
  int k_1;
  double eps;
  int iter;
  int pp;
  double t_3;
  double t_2;
  int p;
  double t_1;
  double t;
  int nrt;
  int nct;
  int k;
  int j;
  int i;
  int wantv;
  int wantu;
  DynamicRectMatrix<double> A;
  DynamicVector<double,_std::allocator<double>_> work;
  DynamicVector<double,_std::allocator<double>_> e;
  int nu;
  allocator_type *in_stack_fffffffffffff3b8;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffff3c0;
  SelfType *in_stack_fffffffffffff3c8;
  DynamicRectMatrix<double> *in_stack_fffffffffffff3d0;
  DynamicRectMatrix<double> *in_stack_fffffffffffff3e0;
  DynamicRectMatrix<double> *in_stack_fffffffffffff3e8;
  value_type local_b78;
  double local_6d0;
  double local_6b0;
  double local_210;
  double local_208;
  double local_200;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  value_type local_178;
  double local_170;
  double local_168;
  double local_160;
  value_type local_158;
  double local_150;
  int local_144;
  undefined4 local_140;
  uint local_13c;
  double local_138;
  int local_130;
  int local_12c;
  double local_128;
  double local_120;
  int local_118;
  int local_114;
  double local_110;
  double local_108;
  int local_100 [3];
  int local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  int local_e0;
  uint local_dc;
  DynamicRectMatrix<double> local_d8 [3];
  undefined1 local_a0 [92];
  int local_44 [8];
  int local_24;
  DynamicRectMatrix<double> *local_10;
  
  local_10 = in_RSI;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(in_RDI);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(in_RDI + 1);
  std::allocator<double>::allocator((allocator<double> *)0x3b9cfb);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::allocator<double>::~allocator((allocator<double> *)0x3b9d1f);
  uVar6 = OpenMD::DynamicRectMatrix<double>::getNRow(local_10);
  in_RDI[3].nrow_ = uVar6;
  uVar6 = OpenMD::DynamicRectMatrix<double>::getNCol(local_10);
  in_RDI[3].ncol_ = uVar6;
  piVar8 = std::min<int>((int *)&in_RDI[3].nrow_,(int *)&in_RDI[3].ncol_);
  local_24 = *piVar8;
  local_44[0] = in_RDI[3].nrow_ + 1;
  std::min<int>(local_44,(int *)&in_RDI[3].ncol_);
  std::allocator<double>::allocator((allocator<double> *)0x3b9df1);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8,
             (allocator_type *)0x3b9e0e);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffff3c0,
             (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff3b8);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x3b9e3e);
  std::allocator<double>::~allocator((allocator<double> *)0x3b9e4b);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            (in_stack_fffffffffffff3d0,(uint)((ulong)in_stack_fffffffffffff3c8 >> 0x20),
             (uint)in_stack_fffffffffffff3c8,(double)in_stack_fffffffffffff3c0);
  OpenMD::DynamicRectMatrix<double>::operator=(in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3b9e9b);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3b9ea8);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            (in_stack_fffffffffffff3d0,(uint)((ulong)in_stack_fffffffffffff3c8 >> 0x20),
             (uint)in_stack_fffffffffffff3c8);
  OpenMD::DynamicRectMatrix<double>::operator=(in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3b9ef4);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3b9f01);
  std::allocator<double>::allocator((allocator<double> *)0x3b9f2a);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8,
             (allocator_type *)0x3b9f47);
  std::allocator<double>::~allocator((allocator<double> *)0x3b9f56);
  std::allocator<double>::allocator((allocator<double> *)0x3b9f7f);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8,
             (allocator_type *)0x3b9f9c);
  std::allocator<double>::~allocator((allocator<double> *)0x3b9fab);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  local_dc = 1;
  local_e0 = 1;
  local_e4 = 0;
  local_e8 = 0;
  local_ec = 0;
  local_f4 = in_RDI[3].nrow_ - 1;
  puVar9 = (uint *)std::min<int>(&local_f4,(int *)&in_RDI[3].ncol_);
  local_f0 = *puVar9;
  local_100[1] = 0;
  local_100[0] = in_RDI[3].ncol_ - 2;
  piVar8 = std::min<int>(local_100,(int *)&in_RDI[3].nrow_);
  puVar9 = (uint *)std::max<int>(local_100 + 1,piVar8);
  local_100[2] = *puVar9;
  for (local_ec = 0; uVar6 = local_ec, piVar8 = std::max<int>((int *)&local_f0,local_100 + 2),
      (int)uVar6 < *piVar8; local_ec = local_ec + 1) {
    uVar6 = local_ec;
    if ((int)local_ec < (int)local_f0) {
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = 0.0;
      for (local_e4 = local_ec; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_ec);
        dVar13 = hypot(dVar13,*pdVar11);
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar13;
      }
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_ec,local_ec);
        if (*pdVar11 <= 0.0 && *pdVar11 != 0.0) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          vVar1 = *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = -vVar1;
        }
        for (local_e4 = local_ec; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          dVar13 = *pvVar10;
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_ec);
          *pdVar11 = *pdVar11 / dVar13;
        }
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_ec,local_ec);
        *pdVar11 = *pdVar11 + 1.0;
      }
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      vVar1 = *pvVar10;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = -vVar1;
      uVar6 = local_ec;
    }
    while (local_e8 = uVar6 + 1, (int)local_e8 < (int)in_RDI[3].ncol_) {
      if ((int)local_ec < (int)local_f0) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
          local_108 = 0.0;
          for (local_e4 = local_ec; dVar13 = local_108, (int)local_e4 < (int)in_RDI[3].nrow_;
              local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_ec);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_e8);
            local_108 = dVar13 * *pdVar11 + local_108;
          }
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_ec,local_ec);
          local_108 = -dVar13 / *pdVar11;
          for (local_e4 = local_ec; dVar13 = local_108, (int)local_e4 < (int)in_RDI[3].nrow_;
              local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_ec);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_e8);
            *pdVar11 = dVar13 * dVar15 + *pdVar11;
          }
        }
      }
      pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_ec,local_e8);
      dVar13 = *pdVar11;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = dVar13;
      uVar6 = local_e8;
    }
    if ((local_dc & (int)local_ec < (int)local_f0) != 0) {
      for (local_e4 = local_ec; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_ec);
        dVar13 = *pdVar11;
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
        *pdVar11 = dVar13;
      }
    }
    if ((int)local_ec < local_100[2]) {
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = 0.0;
      local_e4 = local_ec;
      while (local_e4 = local_e4 + 1, (int)local_e4 < (int)in_RDI[3].ncol_) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = hypot(dVar13,*pvVar10);
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar13;
      }
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        uVar6 = local_ec;
        if (*pvVar10 <= 0.0 && *pvVar10 != 0.0) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          vVar1 = *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = -vVar1;
          uVar6 = local_ec;
        }
        while (local_e4 = uVar6 + 1, (int)local_e4 < (int)in_RDI[3].ncol_) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          dVar13 = *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = *pvVar10 / dVar13;
          uVar6 = local_e4;
        }
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = *pvVar10 + 1.0;
      }
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      vVar1 = *pvVar10;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = -vVar1;
      iVar7 = local_ec + 1;
      uVar6 = in_RDI[3].nrow_;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      uVar5 = local_ec;
      if (iVar7 < (int)uVar6 && *pvVar10 != 0.0) {
        while (local_e4 = uVar5 + 1, uVar6 = local_ec, (int)local_e4 < (int)in_RDI[3].nrow_) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = 0.0;
          uVar5 = local_e4;
        }
        while (local_e8 = uVar6 + 1, uVar6 = local_ec, (int)local_e8 < (int)in_RDI[3].ncol_) {
          while (local_e4 = uVar6 + 1, uVar6 = local_e8, (int)local_e4 < (int)in_RDI[3].nrow_) {
            pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
            dVar13 = *pvVar10;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_e8);
            dVar15 = *pdVar11;
            pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
            *pvVar10 = dVar13 * dVar15 + *pvVar10;
            uVar6 = local_e4;
          }
        }
        while (local_e8 = uVar6 + 1, (int)local_e8 < (int)in_RDI[3].ncol_) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          dVar13 = *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          local_110 = -dVar13 / *pvVar10;
          local_e4 = local_ec;
          while (dVar13 = local_110, local_e4 = local_e4 + 1, uVar6 = local_e8,
                (int)local_e4 < (int)in_RDI[3].nrow_) {
            pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
            dVar15 = *pvVar10;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_e4,local_e8);
            *pdVar11 = dVar13 * dVar15 + *pdVar11;
          }
        }
      }
      uVar6 = local_ec;
      if (local_e0 != 0) {
        while (local_e4 = uVar6 + 1, (int)local_e4 < (int)in_RDI[3].ncol_) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          vVar1 = *pvVar10;
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_ec);
          *pdVar11 = vVar1;
          uVar6 = local_e4;
        }
      }
    }
  }
  local_118 = in_RDI[3].nrow_ + 1;
  piVar8 = std::min<int>((int *)&in_RDI[3].ncol_,&local_118);
  local_114 = *piVar8;
  if ((int)local_f0 < (int)in_RDI[3].ncol_) {
    pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_f0,local_f0);
    dVar13 = *pdVar11;
    pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                        (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
    *pvVar10 = dVar13;
  }
  if ((int)in_RDI[3].nrow_ < local_114) {
    pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                        (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
    *pvVar10 = 0.0;
  }
  if ((int)(local_100[2] + 1U) < local_114) {
    pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(local_d8,local_100[2],local_114 - 1);
    dVar13 = *pdVar11;
    pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                        (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
    *pvVar10 = dVar13;
  }
  pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                      (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
  *pvVar10 = 0.0;
  if (local_dc != 0) {
    for (local_e8 = local_f0; uVar6 = local_f0, (int)local_e8 < local_24; local_e8 = local_e8 + 1) {
      for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
        *pdVar11 = 0.0;
      }
      pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e8,local_e8);
      *pdVar11 = 1.0;
    }
    while (local_ec = uVar6 - 1, -1 < (int)local_ec) {
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      uVar6 = local_ec;
      if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
        while (local_e8 = uVar6 + 1, (int)local_e8 < local_24) {
          local_120 = 0.0;
          for (local_e4 = local_ec; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            local_120 = dVar13 * *pdVar11 + local_120;
          }
          dVar13 = -local_120;
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_ec,local_ec);
          local_120 = dVar13 / *pdVar11;
          for (local_e4 = local_ec; dVar13 = local_120, uVar6 = local_e8,
              (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            *pdVar11 = dVar13 * dVar15 + *pdVar11;
          }
        }
        for (local_e4 = local_ec; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
          dVar13 = *pdVar11;
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
          *pdVar11 = -dVar13;
        }
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_ec,local_ec);
        dVar13 = *pdVar11;
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_ec,local_ec);
        *pdVar11 = dVar13 + 1.0;
        for (local_e4 = 0; uVar6 = local_ec, (int)local_e4 < (int)(local_ec - 1);
            local_e4 = local_e4 + 1) {
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
          *pdVar11 = 0.0;
        }
      }
      else {
        for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_ec);
          *pdVar11 = 0.0;
        }
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_ec,local_ec);
        *pdVar11 = 1.0;
        uVar6 = local_ec;
      }
    }
  }
  if (local_e0 != 0) {
    local_ec = in_RDI[3].ncol_;
    while (local_ec = local_ec - 1, -1 < (int)local_ec) {
      bVar4 = (int)local_ec < local_100[2];
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      uVar6 = local_ec;
      if (bVar4 && *pvVar10 != 0.0) {
        while (local_e8 = uVar6 + 1, (int)local_e8 < local_24) {
          local_128 = 0.0;
          local_e4 = local_ec;
          while (dVar13 = local_128, local_e4 = local_e4 + 1, (int)local_e4 < (int)in_RDI[3].ncol_)
          {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_ec);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            local_128 = dVar13 * *pdVar11 + local_128;
          }
          pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_ec + 1,local_ec);
          local_128 = -dVar13 / *pdVar11;
          local_e4 = local_ec;
          while (dVar13 = local_128, local_e4 = local_e4 + 1, uVar6 = local_e8,
                (int)local_e4 < (int)in_RDI[3].ncol_) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_ec);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            *pdVar11 = dVar13 * dVar15 + *pdVar11;
          }
        }
      }
      for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].ncol_; local_e4 = local_e4 + 1) {
        pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_ec);
        *pdVar11 = 0.0;
      }
      pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_ec,local_ec);
      *pdVar11 = 1.0;
    }
  }
  local_12c = local_114 + -1;
  local_130 = 0;
  local_138 = pow(2.0,-52.0);
  do {
    if (local_114 < 1) {
      OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3be2f9);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
                ((DynamicVector<double,_std::allocator<double>_> *)0x3be306);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
                ((DynamicVector<double,_std::allocator<double>_> *)0x3be313);
      return;
    }
    local_140 = 0;
    local_13c = local_114 + -2;
    while( true ) {
      iVar7 = (int)in_RDI;
      if (((int)local_13c < -1) || (local_13c == -1)) goto LAB_003bbec8;
      iVar12 = (int)local_a0;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      dVar13 = local_138;
      iVar12 = iVar7 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      iVar12 = iVar7 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      if (extraout_XMM0_Qa <= dVar13 * (extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01)) break;
      local_13c = local_13c + -1;
    }
    pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                        (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
    *pvVar10 = 0.0;
LAB_003bbec8:
    iVar12 = local_114;
    if (local_13c == local_114 + -2) {
      local_140 = 4;
    }
    else {
      do {
        local_144 = iVar12 + -1;
        if ((local_144 < (int)local_13c) || (local_144 == local_13c)) goto LAB_003bc0e7;
        if (local_144 == local_114) {
          local_6b0 = 0.0;
        }
        else {
          iVar12 = (int)local_a0;
          OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                    (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          std::abs(iVar12);
          local_6b0 = extraout_XMM0_Qa_02;
        }
        if (local_144 == local_13c + 1) {
          local_6d0 = 0.0;
        }
        else {
          iVar12 = (int)local_a0;
          OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                    (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          std::abs(iVar12);
          local_6d0 = extraout_XMM0_Qa_03;
        }
        local_150 = local_6b0 + local_6d0;
        iVar12 = iVar7 + 0x20;
        OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                  (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        std::abs(iVar12);
        iVar12 = local_144;
      } while (local_138 * local_150 < extraout_XMM0_Qa_04);
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = 0.0;
LAB_003bc0e7:
      if (local_144 == local_13c) {
        local_140 = 3;
      }
      else if (local_144 == local_114 + -1) {
        local_140 = 1;
      }
      else {
        local_140 = 2;
        local_13c = local_144;
      }
    }
    local_13c = local_13c + 1;
    switch(local_140) {
    case 1:
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      local_158 = *pvVar10;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = 0.0;
      for (local_e8 = local_114 - 2; (int)local_13c <= (int)local_e8; local_e8 = local_e8 - 1) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        local_160 = hypot(*pvVar10,local_158);
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = local_160;
        local_168 = *pvVar10 / local_160;
        local_170 = local_158 / local_160;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar13;
        if (local_e8 != local_13c) {
          dVar13 = -local_170;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          dVar15 = local_168;
          local_158 = dVar13 * *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          dVar13 = *pvVar10;
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = dVar15 * dVar13;
        }
        if (local_e0 != 0) {
          for (local_e4 = 0; dVar13 = local_168, (int)local_e4 < (int)in_RDI[3].ncol_;
              local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            dVar16 = local_170;
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_114 - 1);
            local_160 = dVar13 * dVar15 + dVar16 * *pdVar11;
            dVar14 = -local_170;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            dVar16 = local_168;
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_114 - 1);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_114 - 1);
            dVar17 = local_160;
            *pdVar11 = dVar14 * dVar13 + dVar16 * dVar15;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            *pdVar11 = dVar17;
          }
        }
      }
      break;
    case 2:
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      local_178 = *pvVar10;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = 0.0;
      for (local_e8 = local_13c; (int)local_e8 < local_114; local_e8 = local_e8 + 1) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        local_180 = hypot(*pvVar10,local_178);
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = local_180;
        local_188 = *pvVar10 / local_180;
        local_190 = local_178 / local_180;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar13;
        dVar13 = -local_190;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar15 = local_188;
        local_178 = dVar13 * *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar15 * dVar13;
        if (local_dc != 0) {
          for (local_e4 = 0; dVar13 = local_188, (int)local_e4 < (int)in_RDI[3].nrow_;
              local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            dVar16 = local_190;
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c - 1);
            local_180 = dVar13 * dVar15 + dVar16 * *pdVar11;
            dVar14 = -local_190;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            dVar16 = local_188;
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c - 1);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c - 1);
            dVar17 = local_180;
            *pdVar11 = dVar14 * dVar13 + dVar16 * dVar15;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            *pdVar11 = dVar17;
          }
        }
      }
      break;
    case 3:
      iVar12 = iVar7 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      iVar12 = iVar7 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      pdVar11 = std::max<double>(&local_1a0,&local_1a8);
      iVar12 = (int)local_a0;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar12);
      pdVar11 = std::max<double>(pdVar11,&local_1b0);
      iVar7 = iVar7 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar7);
      pdVar11 = std::max<double>(pdVar11,&local_1b8);
      iVar7 = (int)local_a0;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      std::abs(iVar7);
      pdVar11 = std::max<double>(pdVar11,&local_1c0);
      local_198 = *pdVar11;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      dVar13 = *pvVar10 / local_198;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      dVar15 = *pvVar10 / local_198;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      dVar16 = *pvVar10 / local_198;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      local_210 = *pvVar10 / local_198;
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      dVar17 = *pvVar10 / local_198;
      dVar15 = ((dVar15 + dVar13) * (dVar15 - dVar13) + dVar16 * dVar16) / 2.0;
      dVar16 = dVar13 * dVar16 * dVar13 * dVar16;
      local_200 = 0.0;
      if ((((dVar15 != 0.0) || (NAN(dVar15))) || (dVar16 != 0.0)) || (NAN(dVar16))) {
        local_200 = sqrt(dVar15 * dVar15 + dVar16);
        if (dVar15 < 0.0) {
          local_200 = -local_200;
        }
        local_200 = dVar16 / (dVar15 + local_200);
      }
      local_208 = (local_210 + dVar13) * (local_210 - dVar13) + local_200;
      local_210 = local_210 * dVar17;
      for (local_e8 = local_13c; (int)local_e8 < local_114 + -1; local_e8 = local_e8 + 1) {
        dVar13 = hypot(local_208,local_210);
        local_208 = local_208 / dVar13;
        local_210 = local_210 / dVar13;
        if (local_e8 != local_13c) {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          *pvVar10 = dVar13;
        }
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar16 = local_208 * dVar13 + local_210 * *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar15 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = local_208 * dVar13 - local_210 * dVar15;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar15 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = local_208 * dVar15;
        if (local_e0 != 0) {
          for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].ncol_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_e8 + 1);
            dVar17 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            dVar14 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_e8 + 1);
            dVar2 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_e8 + 1);
            *pdVar11 = -local_210 * dVar14 + local_208 * dVar2;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_e8);
            *pdVar11 = local_208 * dVar15 + local_210 * dVar17;
          }
        }
        dVar15 = hypot(dVar16,local_210 * dVar13);
        dVar16 = dVar16 / dVar15;
        dVar17 = (local_210 * dVar13) / dVar15;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar15;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        local_208 = dVar16 * dVar13 + dVar17 * *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar15 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = -dVar17 * dVar13 + dVar16 * dVar15;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        local_210 = dVar17 * *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = dVar16 * dVar13;
        if ((local_dc != 0) && ((int)local_e8 < (int)(in_RDI[3].nrow_ - 1))) {
          for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8 + 1);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            dVar14 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8 + 1);
            dVar2 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8 + 1);
            *pdVar11 = -dVar17 * dVar14 + dVar16 * dVar2;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_e8);
            *pdVar11 = dVar16 * dVar13 + dVar17 * dVar15;
          }
        }
      }
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      *pvVar10 = local_208;
      local_130 = local_130 + 1;
      break;
    case 4:
      pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                          (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
      if (*pvVar10 <= 0.0) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        if (0.0 < *pvVar10 || *pvVar10 == 0.0) {
          local_b78 = 0.0;
        }
        else {
          pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                              (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
          local_b78 = -*pvVar10;
        }
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = local_b78;
        if (local_e0 != 0) {
          for (local_e4 = 0; (int)local_e4 <= local_12c; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_13c);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_13c);
            *pdVar11 = -dVar13;
          }
        }
      }
      for (; (int)local_13c < local_12c; local_13c = local_13c + 1) {
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        dVar13 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        if (*pvVar10 <= dVar13) break;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        vVar1 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        vVar3 = *pvVar10;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = vVar3;
        pvVar10 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                            (in_stack_fffffffffffff3c0,(size_type)in_stack_fffffffffffff3b8);
        *pvVar10 = vVar1;
        if ((local_e0 != 0) && ((int)local_13c < (int)(in_RDI[3].ncol_ - 1))) {
          for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].ncol_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_13c + 1);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_13c);
            dVar15 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()
                                (in_RDI + 1,local_e4,local_13c + 1);
            *pdVar11 = dVar15;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI + 1,local_e4,local_13c);
            *pdVar11 = dVar13;
          }
        }
        if ((local_dc != 0) && ((int)local_13c < (int)(in_RDI[3].nrow_ - 1))) {
          for (local_e4 = 0; (int)local_e4 < (int)in_RDI[3].nrow_; local_e4 = local_e4 + 1) {
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c + 1);
            in_stack_fffffffffffff3b8 = (allocator_type *)*pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c);
            dVar13 = *pdVar11;
            pdVar11 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c + 1);
            *pdVar11 = dVar13;
            in_stack_fffffffffffff3c0 =
                 (DynamicVector<double,_std::allocator<double>_> *)
                 OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_e4,local_13c);
            (in_stack_fffffffffffff3c0->data_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff3b8;
          }
        }
      }
      local_130 = 0;
      local_114 = local_114 + -1;
    }
  } while( true );
}

Assistant:

SVD(const DynamicRectMatrix<Real>& Arg) {
      m      = Arg.getNRow();
      n      = Arg.getNCol();
      int nu = min(m, n);
      s      = DynamicVector<Real>(min(m + 1, n));
      U      = DynamicRectMatrix<Real>(m, nu, Real(0));
      V      = DynamicRectMatrix<Real>(n, n);
      DynamicVector<Real> e(n);
      DynamicVector<Real> work(m);
      DynamicRectMatrix<Real> A(Arg);

      int wantu = 1; /* boolean */
      int wantv = 1; /* boolean */
      int i = 0, j = 0, k = 0;

      // Reduce A to bidiagonal form, storing the diagonal elements
      // in s and the super-diagonal elements in e.

      int nct = min(m - 1, n);
      int nrt = max(0, min(n - 2, m));

      for (k = 0; k < max(nct, nrt); k++) {
        if (k < nct) {
          // Compute the transformation for the k-th column and
          // place the k-th diagonal in s(k).
          // Compute 2-norm of k-th column without under/overflow.
          s(k) = 0;
          for (i = k; i < m; i++) {
            s(k) = hypot(s(k), A(i, k));
          }
          if (s(k) != 0.0) {
            if (A(k, k) < 0.0) { s(k) = -s(k); }
            for (i = k; i < m; i++) {
              A(i, k) /= s(k);
            }
            A(k, k) += 1.0;
          }
          s(k) = -s(k);
        }
        for (j = k + 1; j < n; j++) {
          if ((k < nct) && (s(k) != 0.0)) {
            // Apply the transformation.

            Real t(0.0);
            for (i = k; i < m; i++) {
              t += A(i, k) * A(i, j);
            }
            t = -t / A(k, k);
            for (i = k; i < m; i++) {
              A(i, j) += t * A(i, k);
            }
          }

          // Place the k-th row of A into e for the
          // subsequent calculation of the row transformation.

          e(j) = A(k, j);
        }
        if (wantu & (k < nct)) {
          // Place the transformation in U for subsequent back
          // multiplication.

          for (i = k; i < m; i++) {
            U(i, k) = A(i, k);
          }
        }
        if (k < nrt) {
          // Compute the k-th row transformation and place the
          // k-th super-diagonal in e(k).
          // Compute 2-norm without under/overflow.
          e(k) = 0;
          for (i = k + 1; i < n; i++) {
            e(k) = hypot(e(k), e(i));
          }
          if (e(k) != 0.0) {
            if (e(k + 1) < 0.0) { e(k) = -e(k); }
            for (i = k + 1; i < n; i++) {
              e(i) /= e(k);
            }
            e(k + 1) += 1.0;
          }
          e(k) = -e(k);
          if ((k + 1 < m) & (e(k) != 0.0)) {
            // Apply the transformation.

            for (i = k + 1; i < m; i++) {
              work(i) = 0.0;
            }
            for (j = k + 1; j < n; j++) {
              for (i = k + 1; i < m; i++) {
                work(i) += e(j) * A(i, j);
              }
            }
            for (j = k + 1; j < n; j++) {
              Real t(-e(j) / e(k + 1));
              for (i = k + 1; i < m; i++) {
                A(i, j) += t * work(i);
              }
            }
          }
          if (wantv) {
            // Place the transformation in V for subsequent
            // back multiplication.

            for (i = k + 1; i < n; i++) {
              V(i, k) = e(i);
            }
          }
        }
      }

      // Set up the final bidiagonal matrix or order p.

      int p = min(n, m + 1);
      if (nct < n) { s(nct) = A(nct, nct); }
      if (m < p) { s(p - 1) = 0.0; }
      if (nrt + 1 < p) { e(nrt) = A(nrt, p - 1); }
      e(p - 1) = 0.0;

      // If required, generate U.

      if (wantu) {
        for (j = nct; j < nu; j++) {
          for (i = 0; i < m; i++) {
            U(i, j) = 0.0;
          }
          U(j, j) = 1.0;
        }
        for (k = nct - 1; k >= 0; k--) {
          if (s(k) != 0.0) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k; i < m; i++) {
                t += U(i, k) * U(i, j);
              }
              t = -t / U(k, k);
              for (i = k; i < m; i++) {
                U(i, j) += t * U(i, k);
              }
            }
            for (i = k; i < m; i++) {
              U(i, k) = -U(i, k);
            }
            U(k, k) = 1.0 + U(k, k);
            for (i = 0; i < k - 1; i++) {
              U(i, k) = 0.0;
            }
          } else {
            for (i = 0; i < m; i++) {
              U(i, k) = 0.0;
            }
            U(k, k) = 1.0;
          }
        }
      }

      // If required, generate V.

      if (wantv) {
        for (k = n - 1; k >= 0; k--) {
          if ((k < nrt) & (e(k) != 0.0)) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k + 1; i < n; i++) {
                t += V(i, k) * V(i, j);
              }
              t = -t / V(k + 1, k);
              for (i = k + 1; i < n; i++) {
                V(i, j) += t * V(i, k);
              }
            }
          }
          for (i = 0; i < n; i++) {
            V(i, k) = 0.0;
          }
          V(k, k) = 1.0;
        }
      }

      // Main iteration loop for the singular values.

      int pp   = p - 1;
      int iter = 0;
      Real eps(pow(2.0, -52.0));
      while (p > 0) {
        int k    = 0;
        int kase = 0;

        // Here is where a test for too many iterations would go.

        // This section of the program inspects for
        // negligible elements in the s and e arrays.  On
        // completion the variables kase and k are set as follows.

        // kase = 1     if s(p) and e(k-1) are negligible and k<p
        // kase = 2     if s(k) is negligible and k<p
        // kase = 3     if e(k-1) is negligible, k<p, and
        //              s(k), ..., s(p) are not negligible (qr step).
        // kase = 4     if e(p-1) is negligible (convergence).

        for (k = p - 2; k >= -1; k--) {
          if (k == -1) { break; }
          if (abs(e(k)) <= eps * (abs(s(k)) + abs(s(k + 1)))) {
            e(k) = 0.0;
            break;
          }
        }
        if (k == p - 2) {
          kase = 4;
        } else {
          int ks;
          for (ks = p - 1; ks >= k; ks--) {
            if (ks == k) { break; }
            Real t((ks != p ? abs(e(ks)) : 0.) +
                   (ks != k + 1 ? abs(e(ks - 1)) : 0.));
            if (abs(s(ks)) <= eps * t) {
              s(ks) = 0.0;
              break;
            }
          }
          if (ks == k) {
            kase = 3;
          } else if (ks == p - 1) {
            kase = 1;
          } else {
            kase = 2;
            k    = ks;
          }
        }
        k++;

        // Perform the task indicated by kase.

        switch (kase) {
          // Deflate negligible s(p).

        case 1: {
          Real f(e(p - 2));
          e(p - 2) = 0.0;
          for (j = p - 2; j >= k; j--) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            if (j != k) {
              f        = -sn * e(j - 1);
              e(j - 1) = cs * e(j - 1);
            }
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, p - 1);
                V(i, p - 1) = -sn * V(i, j) + cs * V(i, p - 1);
                V(i, j)     = t;
              }
            }
          }
        } break;

          // Split at negligible s(k).

        case 2: {
          Real f(e(k - 1));
          e(k - 1) = 0.0;
          for (j = k; j < p; j++) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            f    = -sn * e(j);
            e(j) = cs * e(j);
            if (wantu) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, k - 1);
                U(i, k - 1) = -sn * U(i, j) + cs * U(i, k - 1);
                U(i, j)     = t;
              }
            }
          }
        } break;

          // Perform one qr step.

        case 3: {
          // Calculate the shift.

          Real scale =
              max(max(max(max(abs(s(p - 1)), abs(s(p - 2))), abs(e(p - 2))),
                      abs(s(k))),
                  abs(e(k)));
          Real sp    = s(p - 1) / scale;
          Real spm1  = s(p - 2) / scale;
          Real epm1  = e(p - 2) / scale;
          Real sk    = s(k) / scale;
          Real ek    = e(k) / scale;
          Real b     = ((spm1 + sp) * (spm1 - sp) + epm1 * epm1) / 2.0;
          Real c     = (sp * epm1) * (sp * epm1);
          Real shift = 0.0;
          if ((b != 0.0) || (c != 0.0)) {
            shift = sqrt(b * b + c);
            if (b < 0.0) { shift = -shift; }
            shift = c / (b + shift);
          }
          Real f = (sk + sp) * (sk - sp) + shift;
          Real g = sk * ek;

          // Chase zeros.

          for (j = k; j < p - 1; j++) {
            Real t  = hypot(f, g);
            Real cs = f / t;
            Real sn = g / t;
            if (j != k) { e(j - 1) = t; }
            f        = cs * s(j) + sn * e(j);
            e(j)     = cs * e(j) - sn * s(j);
            g        = sn * s(j + 1);
            s(j + 1) = cs * s(j + 1);
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, j + 1);
                V(i, j + 1) = -sn * V(i, j) + cs * V(i, j + 1);
                V(i, j)     = t;
              }
            }
            t        = hypot(f, g);
            cs       = f / t;
            sn       = g / t;
            s(j)     = t;
            f        = cs * e(j) + sn * s(j + 1);
            s(j + 1) = -sn * e(j) + cs * s(j + 1);
            g        = sn * e(j + 1);
            e(j + 1) = cs * e(j + 1);
            if (wantu && (j < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, j + 1);
                U(i, j + 1) = -sn * U(i, j) + cs * U(i, j + 1);
                U(i, j)     = t;
              }
            }
          }
          e(p - 2) = f;
          iter     = iter + 1;
        } break;

          // Convergence.

        case 4: {
          // Make the singular values positive.

          if (s(k) <= 0.0) {
            s(k) = (s(k) < 0.0 ? -s(k) : 0.0);
            if (wantv) {
              for (i = 0; i <= pp; i++) {
                V(i, k) = -V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp) {
            if (s(k) >= s(k + 1)) { break; }
            Real t   = s(k);
            s(k)     = s(k + 1);
            s(k + 1) = t;
            if (wantv && (k < n - 1)) {
              for (i = 0; i < n; i++) {
                t           = V(i, k + 1);
                V(i, k + 1) = V(i, k);
                V(i, k)     = t;
              }
            }
            if (wantu && (k < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = U(i, k + 1);
                U(i, k + 1) = U(i, k);
                U(i, k)     = t;
              }
            }
            k++;
          }
          iter = 0;
          p--;
        } break;
        }
      }
    }